

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O1

Gia_Man_t * Bmcg_ManUnfold(Bmcg_Man_t *p,int f,int nFramesAdd)

{
  Gia_Man_t **p_00;
  undefined4 *puVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  Gia_Man_t *pGVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  void *__s;
  void **ppvVar10;
  Gia_Man_t *pGVar11;
  Vec_Int_t *pVVar12;
  uint *puVar13;
  int Fill;
  ulong uVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  size_t __size;
  uint uVar18;
  int local_68;
  
  pGVar11 = p->pFrames;
  if (pGVar11->vCos->nSize - pGVar11->nRegs != (p->pGia->vCos->nSize - p->pGia->nRegs) * f) {
    __assert_fail("Gia_ManPoNum(p->pFrames) == f * Gia_ManPoNum(p->pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcG.c"
                  ,0xc0,"Gia_Man_t *Bmcg_ManUnfold(Bmcg_Man_t *, int, int)");
  }
  if (0 < nFramesAdd) {
    iVar9 = pGVar11->nObjs;
    bVar5 = true;
    uVar17 = 0;
    do {
      __size = (long)p->pGia->nObjs << 2;
      __s = malloc(__size);
      memset(__s,0xff,__size);
      uVar6 = (p->vGia2Fr).nCap;
      if ((p->vGia2Fr).nSize == uVar6) {
        if ((int)uVar6 < 0x10) {
          ppvVar10 = (p->vGia2Fr).pArray;
          if (ppvVar10 == (void **)0x0) {
            ppvVar10 = (void **)malloc(0x80);
          }
          else {
            ppvVar10 = (void **)realloc(ppvVar10,0x80);
          }
          (p->vGia2Fr).pArray = ppvVar10;
          iVar15 = 0x10;
        }
        else {
          iVar15 = uVar6 * 2;
          if (iVar15 <= (int)uVar6) goto LAB_0056b197;
          ppvVar10 = (p->vGia2Fr).pArray;
          if (ppvVar10 == (void **)0x0) {
            ppvVar10 = (void **)malloc((ulong)uVar6 << 4);
          }
          else {
            ppvVar10 = (void **)realloc(ppvVar10,(ulong)uVar6 << 4);
          }
          (p->vGia2Fr).pArray = ppvVar10;
        }
        (p->vGia2Fr).nCap = iVar15;
      }
LAB_0056b197:
      uVar6 = (p->vGia2Fr).nSize;
      (p->vGia2Fr).nSize = uVar6 + 1;
      (p->vGia2Fr).pArray[(int)uVar6] = __s;
      uVar14 = (uint)f + uVar17;
      if (uVar14 != uVar6) {
        __assert_fail("Vec_PtrSize(&p->vGia2Fr) == f+k+1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcG.c"
                      ,0xc5,"Gia_Man_t *Bmcg_ManUnfold(Bmcg_Man_t *, int, int)");
      }
      iVar15 = (int)uVar14;
      if ((iVar15 < 0) || ((p->vGia2Fr).nSize <= iVar15)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (undefined4 *)(p->vGia2Fr).pArray[uVar14];
      *puVar1 = 0;
      pGVar11 = p->pGia;
      pVVar12 = pGVar11->vCos;
      uVar6 = pVVar12->nSize;
      uVar14 = (ulong)uVar6;
      if (pGVar11->nRegs < (int)uVar6) {
        lVar16 = 0;
        do {
          uVar6 = (uint)uVar14;
          if ((int)uVar6 <= lVar16) goto LAB_0056b56e;
          iVar7 = pVVar12->pArray[lVar16];
          if (((long)iVar7 < 0) || (pGVar11->nObjs <= iVar7)) goto LAB_0056b530;
          if (pGVar11->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar3 = pGVar11->pObjs + iVar7;
          uVar6 = Bmcg_ManUnfold_rec(p,iVar7 - (*(uint *)pGVar3 & 0x1fffffff),iVar15);
          if ((int)uVar6 < 0) goto LAB_0056b58d;
          uVar18 = *(uint *)pGVar3 >> 0x1d & 1;
          iVar7 = Gia_ManAppendCo(p->pFrames,uVar18 ^ uVar6);
          pGVar2 = p->pGia->pObjs;
          if ((pGVar3 < pGVar2) || (pGVar2 + p->pGia->nObjs <= pGVar3)) goto LAB_0056b54f;
          puVar1[(int)((ulong)((long)pGVar3 - (long)pGVar2) >> 2) * -0x55555555] = iVar7;
          bVar5 = (bool)(bVar5 & uVar18 == uVar6);
          lVar16 = lVar16 + 1;
          pGVar11 = p->pGia;
          pVVar12 = pGVar11->vCos;
          uVar6 = pVVar12->nSize;
          uVar14 = (ulong)(int)uVar6;
        } while (lVar16 < (long)(uVar14 - (long)pGVar11->nRegs));
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != (uint)nFramesAdd);
    if (!bVar5) {
      Vec_IntFillExtra(&p->vFr2Sat,p->pFrames->nObjs,uVar6);
      Vec_IntFillExtra(&p->pFrames->vCopies,p->pFrames->nObjs,Fill);
      p_00 = &p->pClean;
      Gia_ManStopP(p_00);
      pGVar11 = Gia_ManStart((p->pFrames->nObjs - iVar9) + 1000);
      p->pClean = pGVar11;
      if (0 < (p->pFrames->vCopies).nSize) {
        *(p->pFrames->vCopies).pArray = 0;
        iVar9 = 0;
        local_68 = f;
        do {
          iVar15 = p->pGia->vCos->nSize;
          iVar7 = p->pGia->nRegs;
          iVar8 = iVar15 - iVar7;
          if (iVar8 != 0 && iVar7 <= iVar15) {
            iVar15 = 0;
            do {
              uVar6 = iVar8 * local_68 + iVar15;
              if ((int)uVar6 < 0) {
LAB_0056b56e:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              pGVar11 = p->pFrames;
              if (pGVar11->vCos->nSize <= (int)uVar6) goto LAB_0056b56e;
              iVar7 = pGVar11->vCos->pArray[uVar6];
              lVar16 = (long)iVar7;
              if ((lVar16 < 0) || (pGVar11->nObjs <= iVar7)) {
LAB_0056b530:
                __assert_fail("v >= 0 && v < p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
              }
              pGVar3 = pGVar11->pObjs;
              uVar6 = Bmcg_ManCollect_rec(p,iVar7 - (*(uint *)(pGVar3 + lVar16) & 0x1fffffff));
              if ((int)uVar6 < 0) {
LAB_0056b58d:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x132,"int Abc_LitNotCond(int, int)");
              }
              pGVar3 = pGVar3 + lVar16;
              uVar6 = Gia_ManAppendCo(p->pClean,*(uint *)pGVar3 >> 0x1d & 1 ^ uVar6);
              pGVar11 = p->pFrames;
              pGVar2 = pGVar11->pObjs;
              if ((pGVar3 < pGVar2) || (pGVar2 + pGVar11->nObjs <= pGVar3)) {
LAB_0056b54f:
                __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                              ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
              }
              if ((int)uVar6 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x12f,"int Abc_Lit2Var(int)");
              }
              if ((*p_00)->nObjs <= (int)(uVar6 >> 1)) goto LAB_0056b530;
              uVar18 = (int)((long)pGVar3 - (long)pGVar2 >> 2) * -0x55555555;
              (*p_00)->pObjs[uVar6 >> 1].Value = uVar18;
              if (((int)uVar18 < 0) || ((pGVar11->vCopies).nSize <= (int)uVar18)) goto LAB_0056b5ac;
              (pGVar11->vCopies).pArray[uVar18 & 0x7fffffff] = uVar6;
              iVar15 = iVar15 + 1;
              iVar8 = p->pGia->vCos->nSize - p->pGia->nRegs;
            } while (iVar15 < iVar8);
          }
          iVar9 = iVar9 + 1;
          local_68 = local_68 + 1;
        } while (iVar9 != nFramesAdd);
        pGVar11 = *p_00;
        *p_00 = (Gia_Man_t *)0x0;
        if (pGVar11->nObjs < 1) {
          return pGVar11;
        }
        if (pGVar11->pObjs == (Gia_Obj_t *)0x0) {
          return pGVar11;
        }
        pGVar4 = p->pFrames;
        puVar13 = &pGVar11->pObjs->Value;
        lVar16 = 0;
        while( true ) {
          uVar6 = *puVar13;
          if (((long)(int)uVar6 < 0) || ((pGVar4->vCopies).nSize <= (int)uVar6)) break;
          (pGVar4->vCopies).pArray[(int)uVar6] = -1;
          lVar16 = lVar16 + 1;
          puVar13 = puVar13 + 3;
          if (pGVar11->nObjs <= lVar16) {
            return pGVar11;
          }
        }
      }
LAB_0056b5ac:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
  }
  return (Gia_Man_t *)0x0;
}

Assistant:

Gia_Man_t * Bmcg_ManUnfold( Bmcg_Man_t * p, int f, int nFramesAdd )
{
    Gia_Man_t * pNew = NULL; Gia_Obj_t * pObj;
    int i, k, iLitFrame, iLitClean, fTrivial = 1;
    int * pCopies, nFrameObjs = Gia_ManObjNum(p->pFrames);
    assert( Gia_ManPoNum(p->pFrames) == f * Gia_ManPoNum(p->pGia) );
    for ( k = 0; k < nFramesAdd; k++ )
    {
        // unfold this timeframe
        Vec_PtrPush( &p->vGia2Fr, ABC_FALLOC(int, Gia_ManObjNum(p->pGia)) );
        assert( Vec_PtrSize(&p->vGia2Fr) == f+k+1 );
        pCopies = Bmcg_ManCopies( p, f+k );
        //memset( pCopies, 0xFF, sizeof(int)*Gia_ManObjNum(p->pGia) );  
        pCopies[0] = 0;
        Gia_ManForEachPo( p->pGia, pObj, i )
        {
            iLitFrame = Bmcg_ManUnfold_rec( p, Gia_ObjFaninId0p(p->pGia, pObj), f+k );
            iLitFrame = Abc_LitNotCond( iLitFrame, Gia_ObjFaninC0(pObj) );
            pCopies[Gia_ObjId(p->pGia, pObj)] = Gia_ManAppendCo( p->pFrames, iLitFrame );
            fTrivial &= (iLitFrame == 0);
        }
    }
    if ( fTrivial )
        return NULL;
    // create a clean copy of the new nodes of this timeframe
    Vec_IntFillExtra( &p->vFr2Sat, Gia_ManObjNum(p->pFrames), -1 );
    Vec_IntFillExtra( &p->pFrames->vCopies, Gia_ManObjNum(p->pFrames), -1 );
    //assert( Vec_IntCountEntry(&p->pFrames->vCopies, -1) == Vec_IntSize(&p->pFrames->vCopies) );
    Gia_ManStopP( &p->pClean );
    p->pClean = Gia_ManStart( Gia_ManObjNum(p->pFrames) - nFrameObjs + 1000 );
    Gia_ObjSetCopyArray( p->pFrames, 0, 0 );
    for ( k = 0; k < nFramesAdd; k++ )
    for ( i = 0; i < Gia_ManPoNum(p->pGia); i++ )
    {
        pObj = Gia_ManCo( p->pFrames, (f+k) * Gia_ManPoNum(p->pGia) + i );
        iLitClean = Bmcg_ManCollect_rec( p, Gia_ObjFaninId0p(p->pFrames, pObj) );
        iLitClean = Abc_LitNotCond( iLitClean, Gia_ObjFaninC0(pObj) );
        iLitClean = Gia_ManAppendCo( p->pClean, iLitClean );
        Gia_ManObj( p->pClean, Abc_Lit2Var(iLitClean) )->Value = Gia_ObjId(p->pFrames, pObj);
        Gia_ObjSetCopyArray( p->pFrames, Gia_ObjId(p->pFrames, pObj), iLitClean );
    }
    pNew = p->pClean; p->pClean = NULL;
    Gia_ManForEachObj( pNew, pObj, i )
        Gia_ObjSetCopyArray( p->pFrames, pObj->Value, -1 );
    return pNew;
}